

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

void threads_end(lzma_stream_coder_conflict1 *coder,lzma_allocator *allocator)

{
  pthread_t *ppVar1;
  worker_thread *pwVar2;
  int iVar3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0x160;
  for (uVar4 = 0; uVar4 < coder->threads_initialized; uVar4 = uVar4 + 1) {
    mythread_mutex_lock((mythread_mutex *)((long)&coder->threads->state + lVar5));
    pwVar2 = coder->threads;
    *(undefined4 *)((long)pwVar2 + lVar5 + -0x160) = 4;
    mythread_cond_signal((mythread_cond *)((long)&pwVar2->allocator + lVar5));
    mythread_mutex_unlock((mythread_mutex *)((long)&coder->threads->state + lVar5));
    lVar5 = lVar5 + 0x1c0;
  }
  lVar5 = 0x1b8;
  uVar4 = 0xffffffffffffffff;
  do {
    uVar4 = uVar4 + 1;
    if (coder->threads_initialized <= uVar4) {
      lzma_free(coder->threads,allocator);
      return;
    }
    ppVar1 = (pthread_t *)((long)&coder->threads->state + lVar5);
    lVar5 = lVar5 + 0x1c0;
    iVar3 = pthread_join(*ppVar1,(void **)0x0);
  } while (iVar3 == 0);
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                ,0x1cd,"void threads_end(lzma_stream_coder *, const lzma_allocator *)");
}

Assistant:

static void
threads_end(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_EXIT;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		int ret = mythread_join(coder->threads[i].thread_id);
		assert(ret == 0);
		(void)ret;
	}

	lzma_free(coder->threads, allocator);
	return;
}